

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall FPolyObj::LinkPolyobj(FPolyObj *this)

{
  uint uVar1;
  double dVar2;
  vertex_t *pvVar3;
  int iVar4;
  double dVar5;
  polyblock_t **pppVar6;
  uint uVar7;
  polyblock_t *ppVar8;
  polyblock_t *ppVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  DVector2 local_40;
  
  (this->Bounds).m_Box[3] = -3.4028234663852886e+38;
  (this->Bounds).m_Box[0] = -3.4028234663852886e+38;
  (this->Bounds).m_Box[2] = 3.4028234663852886e+38;
  (this->Bounds).m_Box[1] = 3.4028234663852886e+38;
  if ((this->Sidedefs).Count != 0) {
    uVar14 = 0;
    do {
      pvVar3 = (this->Sidedefs).Array[uVar14]->linedef->v1;
      local_40.X = (pvVar3->p).X;
      local_40.Y = (pvVar3->p).Y;
      FBoundingBox::AddToBox(&this->Bounds,&local_40);
      pvVar3 = (this->Sidedefs).Array[uVar14]->linedef->v2;
      local_40.X = (pvVar3->p).X;
      local_40.Y = (pvVar3->p).Y;
      FBoundingBox::AddToBox(&this->Bounds,&local_40);
      uVar14 = uVar14 + 1;
    } while (uVar14 < (this->Sidedefs).Count);
  }
  dVar2 = bmaporgx;
  uVar10 = (uint)(((this->Bounds).m_Box[3] - bmaporgx) * 0.0078125);
  this->bbox[3] = uVar10;
  uVar7 = (uint)(((this->Bounds).m_Box[2] - dVar2) * 0.0078125);
  this->bbox[2] = uVar7;
  dVar5 = bmaporgy;
  iVar11 = (int)(((this->Bounds).m_Box[0] - bmaporgy) * 0.0078125);
  dVar2 = (this->Bounds).m_Box[1];
  this->bbox[0] = iVar11;
  iVar12 = (int)((dVar2 - dVar5) * 0.0078125);
  this->bbox[1] = iVar12;
  iVar4 = bmapwidth;
  uVar13 = iVar12 * bmapwidth;
  iVar11 = iVar11 * bmapwidth;
  do {
    if (iVar11 < (int)uVar13) {
      return;
    }
    if ((int)uVar7 <= (int)uVar10) {
      iVar12 = bmapheight * iVar4;
      uVar15 = uVar7;
      do {
        pppVar6 = PolyBlockMap;
        if (((-1 < (int)(uVar15 | uVar13)) && ((int)uVar15 < iVar4)) && ((int)uVar13 < iVar12)) {
          uVar1 = uVar15 + uVar13;
          ppVar9 = PolyBlockMap[uVar1];
          if (PolyBlockMap[uVar1] == (polyblock_t *)0x0) {
            ppVar9 = (polyblock_t *)operator_new(0x18);
            pppVar6[uVar1] = ppVar9;
            ppVar9->next = (polyblock_t *)0x0;
            pppVar6[uVar1]->prev = (polyblock_t *)0x0;
            ppVar9 = pppVar6[uVar1];
          }
          else {
            do {
              ppVar8 = ppVar9;
              if (ppVar8->next == (polyblock_t *)0x0) break;
              ppVar9 = ppVar8->next;
            } while (ppVar8->polyobj != (FPolyObj *)0x0);
            ppVar9 = ppVar8;
            if (ppVar8->polyobj != (FPolyObj *)0x0) {
              ppVar9 = (polyblock_t *)operator_new(0x18);
              ppVar8->next = ppVar9;
              ppVar9->next = (polyblock_t *)0x0;
              ppVar9 = ppVar8->next;
              ppVar9->prev = ppVar8;
            }
          }
          ppVar9->polyobj = this;
        }
        bVar16 = uVar15 != uVar10;
        uVar15 = uVar15 + 1;
      } while (bVar16);
    }
    uVar13 = uVar13 + iVar4;
  } while( true );
}

Assistant:

void FPolyObj::LinkPolyobj ()
{
	polyblock_t **link;
	polyblock_t *tempLink;

	// calculate the polyobj bbox
	Bounds.ClearBox();
	for(unsigned i = 0; i < Sidedefs.Size(); i++)
	{
		vertex_t *vt;
		
		vt = Sidedefs[i]->linedef->v1;
		Bounds.AddToBox(vt->fPos());
		vt = Sidedefs[i]->linedef->v2;
		Bounds.AddToBox(vt->fPos());
	}
	bbox[BOXRIGHT] = GetBlockX(Bounds.Right());
	bbox[BOXLEFT] = GetBlockX(Bounds.Left());
	bbox[BOXTOP] = GetBlockY(Bounds.Top());
	bbox[BOXBOTTOM] = GetBlockY(Bounds.Bottom());
	// add the polyobj to each blockmap section
	for(int j = bbox[BOXBOTTOM]*bmapwidth; j <= bbox[BOXTOP]*bmapwidth;
		j += bmapwidth)
	{
		for(int i = bbox[BOXLEFT]; i <= bbox[BOXRIGHT]; i++)
		{
			if(i >= 0 && i < bmapwidth && j >= 0 && j < bmapheight*bmapwidth)
			{
				link = &PolyBlockMap[j+i];
				if(!(*link))
				{ // Create a new link at the current block cell
					*link = new polyblock_t;
					(*link)->next = NULL;
					(*link)->prev = NULL;
					(*link)->polyobj = this;
					continue;
				}
				else
				{
					tempLink = *link;
					while(tempLink->next != NULL && tempLink->polyobj != NULL)
					{
						tempLink = tempLink->next;
					}
				}
				if(tempLink->polyobj == NULL)
				{
					tempLink->polyobj = this;
					continue;
				}
				else
				{
					tempLink->next = new polyblock_t;
					tempLink->next->next = NULL;
					tempLink->next->prev = tempLink;
					tempLink->next->polyobj = this;
				}
			}
			// else, don't link the polyobj, since it's off the map
		}
	}
}